

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_path * mg_path_alloc(uint32_t node_count,uint32_t relationship_count,uint32_t sequence_length,
                       mg_allocator *allocator)

{
  uint in_ESI;
  uint in_EDI;
  mg_path *path;
  char *block;
  size_t sequence_size;
  size_t relationships_size;
  size_t nodes_size;
  size_t in_stack_ffffffffffffffb8;
  mg_allocator *in_stack_ffffffffffffffc0;
  mg_path *local_8;
  
  local_8 = (mg_path *)mg_allocator_malloc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (local_8 == (mg_path *)0x0) {
    local_8 = (mg_path *)0x0;
  }
  else {
    local_8->nodes = (mg_node **)(local_8 + 1);
    local_8->relationships =
         (mg_unbound_relationship **)(&local_8[1].node_count + (ulong)in_EDI * 2);
    local_8->sequence = (int64_t *)(&local_8[1].node_count + (ulong)in_EDI * 2 + (ulong)in_ESI * 2);
  }
  return local_8;
}

Assistant:

mg_path *mg_path_alloc(uint32_t node_count, uint32_t relationship_count,
                       uint32_t sequence_length, mg_allocator *allocator) {
  size_t nodes_size = node_count * sizeof(mg_node *);
  size_t relationships_size =
      relationship_count * sizeof(mg_unbound_relationship *);
  size_t sequence_size = sequence_length * sizeof(int64_t);
  char *block =
      mg_allocator_malloc(allocator, sizeof(mg_path) + nodes_size +
                                         relationships_size + sequence_size);
  if (!block) {
    return NULL;
  }
  mg_path *path = (mg_path *)block;
  path->nodes = (mg_node **)(block + sizeof(mg_path));
  path->relationships =
      (mg_unbound_relationship **)(block + sizeof(mg_path) + nodes_size);
  path->sequence =
      (int64_t *)(block + sizeof(mg_path) + nodes_size + relationships_size);
  return path;
}